

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::GenerateGraphViz(cmake *this,string *fileName)

{
  cmGlobalGenerator *globalGenerator;
  string *psVar1;
  undefined1 local_180 [8];
  string fallbackSettingsFile;
  undefined1 local_150 [8];
  string settingsFile;
  cmGraphVizWriter gvWriter;
  string *fileName_local;
  cmake *this_local;
  
  globalGenerator = GetGlobalGenerator(this);
  cmGraphVizWriter::cmGraphVizWriter
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),globalGenerator);
  psVar1 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_150,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)local_150,"/CMakeGraphVizOptions.cmake");
  psVar1 = GetHomeDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_180,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)local_180,"/CMakeGraphVizOptions.cmake");
  cmGraphVizWriter::ReadSettings
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),(string *)local_150,
             (string *)local_180);
  cmGraphVizWriter::WritePerTargetFiles
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),fileName);
  cmGraphVizWriter::WriteTargetDependersFiles
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),fileName);
  cmGraphVizWriter::WriteGlobalFile((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),fileName);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)local_150);
  cmGraphVizWriter::~cmGraphVizWriter((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8));
  return;
}

Assistant:

void cmake::GenerateGraphViz(const std::string& fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmGraphVizWriter gvWriter(this->GetGlobalGenerator());

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter.ReadSettings(settingsFile, fallbackSettingsFile);
  gvWriter.WritePerTargetFiles(fileName);
  gvWriter.WriteTargetDependersFiles(fileName);
  gvWriter.WriteGlobalFile(fileName);

#endif
}